

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
CP::priority_queue<int,_std::less<int>_>::at_level
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          priority_queue<int,_std::less<int>_> *this,size_t k)

{
  ulong uVar1;
  unsigned_long *puVar2;
  void *this_00;
  undefined1 local_68 [16];
  pointer local_58;
  ulong local_50;
  size_t i_1;
  size_t i;
  size_t ind;
  undefined1 local_21;
  size_t local_20;
  size_t k_local;
  priority_queue<int,_std::less<int>_> *this_local;
  vector<int,_std::allocator<int>_> *r;
  
  local_21 = 0;
  local_20 = k;
  k_local = (size_t)this;
  this_local = (priority_queue<int,_std::less<int>_> *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,(long)(1 << ((byte)local_20 & 0x1f)));
  i = 0;
  for (i_1 = 0; i_1 < local_20; i_1 = i_1 + 1) {
    i = (long)(1 << ((byte)i_1 & 0x1f)) + i;
  }
  local_50 = i;
  while( true ) {
    uVar1 = local_50;
    local_58 = (pointer)(i + (long)(1 << ((byte)local_20 & 0x1f)));
    puVar2 = std::min<unsigned_long>((unsigned_long *)&local_58,&this->mSize);
    if (*puVar2 <= uVar1) break;
    this_00 = (void *)std::ostream::operator<<(&std::cout,local_50);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::vector<int,std::allocator<int>>::emplace_back<int&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,this->mData + i + local_50)
    ;
    local_50 = local_50 + 1;
  }
  std::vector<int,_std::allocator<int>_>::rbegin
            ((vector<int,_std::allocator<int>_> *)(local_68 + 8));
  std::vector<int,_std::allocator<int>_>::rend((vector<int,_std::allocator<int>_> *)local_68);
  std::
  sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::less<int>>
            ((vector<int,_std::allocator<int>_> *)(local_68 + 8),
             (vector<int,_std::allocator<int>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> CP::priority_queue<T,Comp>::at_level(size_t k) const {
    std::vector<T> r;
    r.reserve(1 << k);
    size_t ind = 0;
    for (size_t i = 0; i < k; ++i) {
        ind += 1 << i;
    }
    for (size_t i = ind; i < std::min(ind + (1 << k), mSize); ++i) {
        std::cout << i << std::endl;
        r.emplace_back(mData[ind+i]);
    }
    std::sort(r.rbegin(), r.rend(), mLess);
    return r;
}